

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

bool __thiscall
cmGlobalGhsMultiGenerator::SetGeneratorPlatform
          (cmGlobalGhsMultiGenerator *this,string *p,cmMakefile *mf)

{
  cmValue cVar1;
  bool bVar2;
  string_view sVar3;
  allocator<char> local_171;
  string local_170;
  cmAlphaNum local_150;
  cmAlphaNum local_120;
  undefined1 local_f0 [8];
  string tgt;
  string local_c8;
  cmValue local_a8;
  cmValue platform;
  allocator<char> local_89;
  undefined1 local_88 [8];
  string arch;
  allocator<char> local_49;
  string local_48;
  cmValue local_28;
  cmValue t;
  cmMakefile *mf_local;
  string *p_local;
  cmGlobalGhsMultiGenerator *this_local;
  
  t.Value = (string *)mf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"GHS_PRIMARY_TARGET",&local_49);
  local_28 = cmMakefile::GetDefinition(mf,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  arch.field_2._8_8_ = local_28.Value;
  bVar2 = cmIsOff(local_28);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_88,"arm",&local_89);
    std::allocator<char>::~allocator(&local_89);
    sVar3 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)p);
    platform.Value = (string *)sVar3._M_len;
    bVar2 = cmIsOff(sVar3);
    if (!bVar2) {
      std::__cxx11::string::operator=((string *)local_88,(string *)p);
    }
    cVar1.Value = t.Value;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"GHS_TARGET_PLATFORM",
               (allocator<char> *)(tgt.field_2._M_local_buf + 0xf));
    local_a8 = cmMakefile::GetDefinition(cVar1.Value,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)(tgt.field_2._M_local_buf + 0xf));
    cmAlphaNum::cmAlphaNum(&local_120,(string *)local_88);
    cmAlphaNum::cmAlphaNum(&local_150,'_');
    cmStrCat<cmValue,char[5]>
              ((string *)local_f0,&local_120,&local_150,&local_a8,(char (*) [5])".tgt");
    cVar1 = t;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_170,"GHS_PRIMARY_TARGET",&local_171);
    sVar3 = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_f0);
    cmMakefile::AddDefinition((cmMakefile *)cVar1.Value,&local_170,sVar3);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator(&local_171);
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)local_88);
  }
  return true;
}

Assistant:

bool cmGlobalGhsMultiGenerator::SetGeneratorPlatform(std::string const& p,
                                                     cmMakefile* mf)
{
  /* set primary target */
  cmValue t = mf->GetDefinition("GHS_PRIMARY_TARGET");
  if (cmIsOff(t)) {
    /* Use the value from `-A` or use `arm` */
    std::string arch = "arm";
    if (!cmIsOff(p)) {
      arch = p;
    }
    cmValue platform = mf->GetDefinition("GHS_TARGET_PLATFORM");
    std::string tgt = cmStrCat(arch, '_', platform, ".tgt");

    /* update the primary target name*/
    mf->AddDefinition("GHS_PRIMARY_TARGET", tgt);
  }
  return true;
}